

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_irExpression *
build_ir_compare(Context_conflict *ctx,MOJOSHADER_irConditionType operation,
                MOJOSHADER_irExpression *left,MOJOSHADER_irExpression *right,
                MOJOSHADER_irExpression *tval,MOJOSHADER_irExpression *fval)

{
  int iVar1;
  uint uVar2;
  MOJOSHADER_astDataTypeType MVar3;
  int iVar4;
  MOJOSHADER_irStatement *pMVar5;
  MOJOSHADER_irExpression *pMVar6;
  MOJOSHADER_irStatement *pMVar7;
  MOJOSHADER_irStatement *pMVar8;
  MOJOSHADER_irStatement *pMVar9;
  MOJOSHADER_irStatement *pMVar10;
  MOJOSHADER_irStatement *next;
  uint writemask;
  MOJOSHADER_irStatement *local_58;
  
  iVar1 = ctx->ir_label_count;
  uVar2 = ctx->ir_temp_count;
  ctx->ir_label_count = iVar1 + 3;
  ctx->ir_temp_count = uVar2 + 1;
  if (((tval != (MOJOSHADER_irExpression *)0x0) && (fval != (MOJOSHADER_irExpression *)0x0)) &&
     (MVar3 = (tval->info).type, MVar3 == (fval->info).type)) {
    iVar4 = (tval->info).elements;
    if (iVar4 == (fval->info).elements) {
      pMVar6 = right;
      pMVar5 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x38,ctx->malloc_data);
      if (pMVar5 == (MOJOSHADER_irStatement *)0x0) {
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
        pMVar5 = (MOJOSHADER_irStatement *)0x0;
      }
      else {
        (pMVar5->ir).type = MOJOSHADER_IR_CJUMP;
        (pMVar5->ir).filename = ctx->sourcefile;
        (pMVar5->ir).line = ctx->sourceline;
        (pMVar5->cjump).cond = operation;
        (pMVar5->move).src = left;
        (pMVar5->cjump).right = right;
        (pMVar5->cjump).iftrue = iVar1;
        (pMVar5->cjump).iffalse = iVar1 + 1;
        pMVar6 = right;
      }
      writemask = (uint)pMVar6;
      local_58 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
      if (local_58 == (MOJOSHADER_irStatement *)0x0) {
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
        local_58 = (MOJOSHADER_irStatement *)0x0;
      }
      else {
        (local_58->ir).type = MOJOSHADER_IR_LABEL;
        (local_58->ir).filename = ctx->sourcefile;
        writemask = ctx->sourceline;
        (local_58->ir).line = writemask;
        (local_58->jump).label = iVar1;
      }
      pMVar6 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
      if (pMVar6 == (MOJOSHADER_irExpression *)0x0) {
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
        pMVar6 = (MOJOSHADER_irExpression *)0x0;
      }
      else {
        (pMVar6->ir).type = MOJOSHADER_IR_TEMP;
        (pMVar6->ir).filename = ctx->sourcefile;
        (pMVar6->ir).line = ctx->sourceline;
        (pMVar6->info).type = MVar3;
        (pMVar6->info).elements = iVar4;
        (pMVar6->temp).index = uVar2;
        writemask = uVar2;
      }
      pMVar7 = new_ir_move(ctx,pMVar6,tval,writemask);
      pMVar8 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
      if (pMVar8 == (MOJOSHADER_irStatement *)0x0) {
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
        pMVar8 = (MOJOSHADER_irStatement *)0x0;
      }
      else {
        (pMVar8->ir).type = MOJOSHADER_IR_JUMP;
        (pMVar8->ir).filename = ctx->sourcefile;
        (pMVar8->ir).line = ctx->sourceline;
        (pMVar8->jump).label = iVar1 + 2;
      }
      pMVar9 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
      if (pMVar9 == (MOJOSHADER_irStatement *)0x0) {
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
        pMVar9 = (MOJOSHADER_irStatement *)0x0;
      }
      else {
        (pMVar9->ir).type = MOJOSHADER_IR_LABEL;
        (pMVar9->ir).filename = ctx->sourcefile;
        (pMVar9->ir).line = ctx->sourceline;
        (pMVar9->jump).label = iVar1 + 1;
      }
      pMVar6 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
      if (pMVar6 == (MOJOSHADER_irExpression *)0x0) {
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
        pMVar6 = (MOJOSHADER_irExpression *)0x0;
      }
      else {
        (pMVar6->ir).type = MOJOSHADER_IR_TEMP;
        (pMVar6->ir).filename = ctx->sourcefile;
        (pMVar6->ir).line = ctx->sourceline;
        (pMVar6->info).type = MVar3;
        (pMVar6->info).elements = iVar4;
        (pMVar6->temp).index = uVar2;
        writemask = uVar2;
      }
      pMVar10 = new_ir_move(ctx,pMVar6,fval,writemask);
      next = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
      if (next == (MOJOSHADER_irStatement *)0x0) {
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
        next = (MOJOSHADER_irStatement *)0x0;
      }
      else {
        (next->ir).type = MOJOSHADER_IR_LABEL;
        (next->ir).filename = ctx->sourcefile;
        (next->ir).line = ctx->sourceline;
        (next->jump).label = iVar1 + 2;
      }
      pMVar10 = new_ir_seq(ctx,pMVar10,next);
      pMVar9 = new_ir_seq(ctx,pMVar9,pMVar10);
      pMVar8 = new_ir_seq(ctx,pMVar8,pMVar9);
      pMVar7 = new_ir_seq(ctx,pMVar7,pMVar8);
      pMVar7 = new_ir_seq(ctx,local_58,pMVar7);
      pMVar5 = new_ir_seq(ctx,pMVar5,pMVar7);
      pMVar6 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
      if (pMVar6 == (MOJOSHADER_irExpression *)0x0) {
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
        pMVar6 = (MOJOSHADER_irExpression *)0x0;
      }
      else {
        (pMVar6->ir).type = MOJOSHADER_IR_TEMP;
        (pMVar6->ir).filename = ctx->sourcefile;
        (pMVar6->ir).line = ctx->sourceline;
        (pMVar6->info).type = MVar3;
        (pMVar6->info).elements = iVar4;
        (pMVar6->temp).index = uVar2;
      }
      pMVar6 = new_ir_eseq(ctx,pMVar5,pMVar6);
      return pMVar6;
    }
    __assert_fail("tval && fval && (tval->info.elements == fval->info.elements)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x12ea,
                  "MOJOSHADER_irExpression *build_ir_compare(Context *, const MOJOSHADER_irConditionType, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *)"
                 );
  }
  __assert_fail("tval && fval && (tval->info.type == fval->info.type)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                ,0x12e9,
                "MOJOSHADER_irExpression *build_ir_compare(Context *, const MOJOSHADER_irConditionType, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *)"
               );
}

Assistant:

static MOJOSHADER_irExpression *build_ir_compare(Context *ctx,
                                    const MOJOSHADER_irConditionType operation,
                                    MOJOSHADER_irExpression *left,
                                    MOJOSHADER_irExpression *right,
                                    MOJOSHADER_irExpression *tval,
                                    MOJOSHADER_irExpression *fval)
{
    /* The gist...
            cjump x < y, t, f  // '<' is whatever operation
        t:
            move tmp, tval
            jump join
        f:
            move tmp, fval
        join:
    */

    const int t = generate_ir_label(ctx);
    const int f = generate_ir_label(ctx);
    const int join = generate_ir_label(ctx);
    const int tmp = generate_ir_temp(ctx);

    assert(tval && fval && (tval->info.type == fval->info.type));
    assert(tval && fval && (tval->info.elements == fval->info.elements));

    const MOJOSHADER_astDataTypeType dt = tval->info.type;
    const int elements = tval->info.elements;

    return new_ir_eseq(ctx,
                new_ir_seq(ctx, new_ir_cjump(ctx, operation, left, right, t, f),
                new_ir_seq(ctx, new_ir_label(ctx, t),
                new_ir_seq(ctx, new_ir_move(ctx, new_ir_temp(ctx, tmp, dt, elements), tval, -1),
                new_ir_seq(ctx, new_ir_jump(ctx, join),
                new_ir_seq(ctx, new_ir_label(ctx, f),
                new_ir_seq(ctx, new_ir_move(ctx, new_ir_temp(ctx, tmp, dt, elements), fval, -1),
                                new_ir_label(ctx, join))))))),
                    new_ir_temp(ctx, tmp, dt, elements));
}